

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
::
Intrusive_list_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
          (Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
           *this,vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *nonZeroRowIndices,Dimension dimension,Column_settings *colSettings)

{
  iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>::Matrix_column_tag,_1U>_*,_false>
  iVar1;
  pointer ppVar2;
  uint uVar3;
  pair<unsigned_int,_unsigned_int> *p;
  pointer ppVar4;
  uint local_3c;
  iterator local_38;
  
  *(Dimension *)this = dimension;
  ppVar4 = (nonZeroRowIndices->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((nonZeroRowIndices->
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_start == ppVar4) {
    uVar3 = 0xffffffff;
  }
  else {
    uVar3 = ppVar4[-1].first;
  }
  *(uint *)(this + 4) = uVar3;
  *(undefined4 *)(this + 8) = 0xffffffff;
  *(undefined1 **)(this + 0x18) = &colSettings->field_0x20;
  iVar1.nodeptr_ = (list_node<void_*> *)(this + 0x20);
  *(list_node<void_*> **)(this + 0x20) = iVar1.nodeptr_;
  *(list_node<void_*> **)(this + 0x28) = iVar1.nodeptr_;
  *(Column_settings **)(this + 0x10) = colSettings;
  ppVar2 = (nonZeroRowIndices->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = (nonZeroRowIndices->
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar2; ppVar4 = ppVar4 + 1) {
    local_3c = ppVar4->second;
    if (**(uint **)(this + 0x10) <= local_3c) {
      local_3c = local_3c % **(uint **)(this + 0x10);
    }
    local_38.members_.nodeptr_ =
         (iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>::Matrix_column_tag,_1U>_*,_false>
          )(iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>::Matrix_column_tag,_1U>_*,_false>
            )iVar1.nodeptr_;
    Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
    ::_insert_entry((Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                     *)this,&local_3c,ppVar4->first,&local_38);
  }
  return;
}

Assistant:

inline Intrusive_list_column<Master_matrix>::Intrusive_list_column(const Container& nonZeroRowIndices,
                                                                   Dimension dimension,
                                                                   Column_settings* colSettings)
    : RA_opt(),
      Dim_opt(dimension),
      Chain_opt([&] {
        if constexpr (Master_matrix::Option_list::is_z2) {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : *std::prev(nonZeroRowIndices.end());
        } else {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : std::prev(nonZeroRowIndices.end())->first;
        }
      }()),
      operators_(nullptr),
      entryPool_(&(colSettings->entryConstructor)),
      column_()
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    for (ID_index id : nonZeroRowIndices) {
      _insert_entry(id, column_.end());
    }
  } else {
    operators_ = &(colSettings->operators);
    for (const auto& p : nonZeroRowIndices) {
      _insert_entry(operators_->get_value(p.second), p.first, column_.end());
    }
  }
}